

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O0

void fill_cache<8u>(Cacheblock<8U>_conflict *cache,size_t N,size_t depth)

{
  bool bVar1;
  ulong uVar2;
  CacheType c;
  CacheType ch;
  uint ci;
  uint si;
  size_t i;
  size_t depth_local;
  size_t N_local;
  Cacheblock<8U>_conflict *cache_local;
  
  _ci = 0;
  do {
    if (N <= _ci) {
      return;
    }
    ch._4_4_ = 0;
    ch._0_4_ = 7;
    c = 0;
    do {
      if (7 < (uint)ch) break;
      uVar2 = (ulong)ch._4_4_;
      c = (ulong)cache[_ci].ptr[depth + uVar2] << ((byte)((uint)ch << 3) & 0x3f) | c;
      ch._0_4_ = (uint)ch - 1;
      ch._4_4_ = ch._4_4_ + 1;
      bVar1 = is_end<unsigned_long>((ulong)cache[_ci].ptr[depth + uVar2]);
    } while (!bVar1);
    cache[_ci].cached_bytes = c;
    _ci = _ci + 1;
  } while( true );
}

Assistant:

static void
fill_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	for (size_t i=0; i < N; ++i) {
		unsigned int j=0;
		while (j < CachedChars && cache[i].ptr[depth+j]) {
			cache[i].chars[j] = cache[i].ptr[depth+j];
			++j;
		}
		while (j < CachedChars) {
			cache[i].chars[j] = 0;
			++j;
		}
	}
}